

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<10,_10,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  Matrix<float,_4,_3> *mat;
  long lVar5;
  undefined1 auVar6 [16];
  bool bVar8;
  undefined4 uVar9;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Type in0;
  float afStack_d8 [6];
  float local_c0 [2];
  undefined8 local_b8;
  undefined4 local_b0;
  float local_a8 [4];
  float local_98 [4];
  float local_88 [4];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Matrix<float,_4,_3> local_40;
  long lVar7;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    puVar1 = &local_68;
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      auVar6 = _DAT_019fcc00;
      do {
        bVar8 = SUB164(auVar6 ^ _DAT_019f5ce0,4) == -0x80000000 &&
                SUB164(auVar6 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
        if (bVar8) {
          uVar9 = 0x3f800000;
          if (lVar2 != lVar5) {
            uVar9 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar5 + -0x10) = uVar9;
        }
        if (bVar8) {
          uVar9 = 0x3f800000;
          if (lVar2 + -0x10 != lVar5) {
            uVar9 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar5) = uVar9;
        }
        lVar7 = auVar6._8_8_;
        auVar6._0_8_ = auVar6._0_8_ + 2;
        auVar6._8_8_ = lVar7 + 2;
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0x40);
      lVar4 = lVar4 + 1;
      lVar2 = lVar2 + 0x10;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
    } while (lVar4 != 4);
    local_78 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_70 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_68 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_60 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_58 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_50 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    mat = (Matrix<float,_4,_3> *)&DAT_00000004;
  }
  else {
    puVar1 = &local_78;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    puVar3 = &s_constInMat3x4;
    mat = (Matrix<float,_4,_3> *)0x0;
    do {
      lVar2 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar2 * 4) = *(undefined4 *)((long)puVar3 + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 0xc);
      mat = (Matrix<float,_4,_3> *)((long)(mat->m_data).m_data[0].m_data + 1);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar3 = puVar3 + 3;
    } while (mat != (Matrix<float,_4,_3> *)&DAT_00000004);
  }
  negate<float,4,3>(&local_40,(MatrixCaseUtils *)&local_78,mat);
  local_88[0] = local_40.m_data.m_data[0].m_data[0];
  local_88[1] = local_40.m_data.m_data[0].m_data[1];
  local_88[2] = local_40.m_data.m_data[0].m_data[2];
  local_98[0] = local_40.m_data.m_data[1].m_data[1];
  local_98[1] = local_40.m_data.m_data[1].m_data[2];
  local_98[2] = local_40.m_data.m_data[1].m_data[3];
  local_c0[0] = 0.0;
  local_c0[1] = 0.0;
  local_b8 = (ulong)local_b8._4_4_ << 0x20;
  lVar2 = 0;
  do {
    local_c0[lVar2] = local_88[lVar2] + local_98[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_a8[0] = local_40.m_data.m_data[2].m_data[2];
  local_a8[1] = local_40.m_data.m_data[2].m_data[3];
  local_a8[2] = local_40.m_data.m_data[2].m_data[0];
  afStack_d8[2] = 0.0;
  afStack_d8[3] = 0.0;
  afStack_d8[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_d8[lVar2 + 2] = local_c0[lVar2] + local_a8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_b8 = 0x100000000;
  local_b0 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)local_c0[lVar2]] = afStack_d8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}